

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O0

QCollatorSortKey QCollator::defaultSortKey(QStringView key)

{
  long lVar1;
  QExplicitlySharedDataPointer<QCollatorSortKeyPrivate> in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_00000030;
  QCollator *in_stack_00000038;
  QStringView *in_stack_ffffffffffffff90;
  QExplicitlySharedDataPointer<QCollatorSortKeyPrivate> this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this.d.ptr = in_RDI.d.ptr;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_>::operator->
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultCollator>_> *
             )0x4c235e);
  QThreadStorage<(anonymous_namespace)::GenerationalCollator>::localData
            ((QThreadStorage<(anonymous_namespace)::GenerationalCollator> *)0x4c2366);
  anon_unknown.dwarf_a1291b::GenerationalCollator::collator((GenerationalCollator *)this.d.ptr);
  QStringView::toString(in_stack_ffffffffffffff90);
  sortKey(in_stack_00000038,in_stack_00000030);
  QString::~QString((QString *)0x4c23a7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QCollatorSortKeyPrivate>)
           (QExplicitlySharedDataPointer<QCollatorSortKeyPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QCollatorSortKey QCollator::defaultSortKey(QStringView key)
{
    return defaultCollator->localData().collator().sortKey(key.toString());
}